

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewSequentialFile
          (PosixEnv *this,string *filename,SequentialFile **result)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *in_RCX;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  iVar1 = open((char *)*result,0x80000);
  if (iVar1 < 0) {
    *in_RCX = 0;
    __errno_location();
    PosixError((string *)this,(int)*result);
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x30);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*result,
               (long)&(*result)->_vptr_SequentialFile + (long)&result[1]->_vptr_SequentialFile);
    *puVar2 = &PTR__PosixSequentialFile_00135b28;
    *(int *)(puVar2 + 1) = iVar1;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_50,local_50 + local_48);
    *in_RCX = puVar2;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status NewSequentialFile(const std::string& filename,
                           SequentialFile** result) override {
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixSequentialFile(filename, fd);
    return Status::OK();
  }